

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_helper.h
# Opt level: O0

void spdlog::details::fmt_helper::pad2(int n,memory_buf_t *dest)

{
  int in_EDI;
  memory_buf_t *in_stack_00000008;
  int in_stack_00000014;
  undefined4 in_stack_00000020;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_00000028;
  char *in_stack_ffffffffffffffd8;
  buffer<char> *in_stack_ffffffffffffffe0;
  
  if (in_EDI < 100) {
    if (in_EDI < 10) {
      if (in_EDI < 0) {
        ::fmt::v6::format_to<char[6],int&,250ul,char>
                  (in_stack_00000028,(char (*) [6])CONCAT44(n,in_stack_00000020),(int *)dest);
      }
      else {
        ::fmt::v6::internal::buffer<char>::push_back
                  (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
        ::fmt::v6::internal::buffer<char>::push_back
                  (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      }
    }
    else {
      ::fmt::v6::internal::buffer<char>::push_back
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      ::fmt::v6::internal::buffer<char>::push_back
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    }
  }
  else {
    append_int<int>(in_stack_00000014,in_stack_00000008);
  }
  return;
}

Assistant:

inline void pad2(int n, memory_buf_t &dest)
{
    if (n > 99)
    {
        append_int(n, dest);
    }
    else if (n > 9) // 10-99
    {
        dest.push_back(static_cast<char>('0' + n / 10));
        dest.push_back(static_cast<char>('0' + n % 10));
    }
    else if (n >= 0) // 0-9
    {
        dest.push_back('0');
        dest.push_back(static_cast<char>('0' + n));
    }
    else // negatives (unlikely, but just in case, let fmt deal with it)
    {
        fmt::format_to(dest, "{:02}", n);
    }
}